

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinLock.hpp
# Opt level: O2

void __thiscall Threading::SpinLock::unlock(SpinLock *this)

{
  string msg;
  
  if (((this->m_IsLocked)._M_base._M_i & 1U) == 0) {
    Diligent::FormatString<char[100]>
              (&msg,(char (*) [100])
                    "Attempting to unlock a spin lock that is not locked. This is a strong indication of a flawed logic."
              );
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"unlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/SpinLock.hpp"
               ,0x50);
    std::__cxx11::string::~string((string *)&msg);
  }
  (this->m_IsLocked)._M_base._M_i = false;
  return;
}

Assistant:

void unlock() noexcept
    {
        VERIFY(is_locked(), "Attempting to unlock a spin lock that is not locked. This is a strong indication of a flawed logic.");
        m_IsLocked.store(false, std::memory_order_release);
    }